

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::MatrixBandPartLayerParams::MergePartialFromCodedStream
          (MatrixBandPartLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  pair<unsigned_long,_bool> pVar11;
  pair<unsigned_long,_bool> pVar12;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bbe10;
      input->buffer_ = pbVar3 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bbe10:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    iVar10 = 6;
    iVar8 = iVar10;
    if ((uVar9 & 0x100000000) == 0) {
LAB_003bbe84:
      iVar8 = 7;
      if (((uVar6 & 7) != 4 && uVar6 != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar8 = iVar10
         , bVar5)) {
LAB_003bbea9:
        iVar8 = 0;
      }
    }
    else {
      uVar7 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar9 != '\x10') goto LAB_003bbe84;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar4 + 1;
          pVar12._8_8_ = 1;
          pVar12.first = (long)(char)uVar2;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_003bbeab;
        this->numupper_ = pVar12.first;
        goto LAB_003bbea9;
      }
      if ((uVar7 != 1) || ((char)uVar9 != '\b')) goto LAB_003bbe84;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar11._8_8_ = 1;
        pVar11.first = (long)(char)uVar2;
      }
      else {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->numlower_ = pVar11.first;
        goto LAB_003bbea9;
      }
    }
LAB_003bbeab:
    if (iVar8 != 0) {
      return iVar8 != 6;
    }
  } while( true );
}

Assistant:

bool MatrixBandPartLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.MatrixBandPartLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 numLower = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &numlower_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 numUpper = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &numupper_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.MatrixBandPartLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.MatrixBandPartLayerParams)
  return false;
#undef DO_
}